

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode connect_init(connectdata *conn,_Bool reinit)

{
  http_connect_state *phVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,reinit) == 0) {
    phVar1 = (http_connect_state *)(*Curl_ccalloc)(1,0x4028);
    if (phVar1 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = phVar1;
  }
  else {
    phVar1 = conn->connect_state;
  }
  phVar1->tunnel_state = TUNNEL_INIT;
  phVar1->keepon = 1;
  phVar1->line_start = phVar1->connect_buffer;
  phVar1->ptr = phVar1->connect_buffer;
  phVar1->cl = 0;
  phVar1->field_0x4024 = phVar1->field_0x4024 & 0xfd;
  return CURLE_OK;
}

Assistant:

static CURLcode connect_init(struct connectdata *conn, bool reinit)
{
  struct http_connect_state *s;
  if(!reinit) {
    DEBUGASSERT(!conn->connect_state);
    s = calloc(1, sizeof(struct http_connect_state));
    if(!s)
      return CURLE_OUT_OF_MEMORY;
    infof(conn->data, "allocate connect buffer!\n");
    conn->connect_state = s;
  }
  else {
    DEBUGASSERT(conn->connect_state);
    s = conn->connect_state;
  }
  s->tunnel_state = TUNNEL_INIT;
  s->keepon = TRUE;
  s->line_start = s->connect_buffer;
  s->ptr = s->line_start;
  s->cl = 0;
  s->close_connection = FALSE;
  return CURLE_OK;
}